

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

int Abc_NtkGetCubePairNum(Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  Abc_Obj_t *pNode;
  ulong uVar3;
  ulong uVar4;
  int i;
  
  if (pNtk->ntkFunc != ABC_FUNC_SOP) {
    __assert_fail("Abc_NtkHasSop(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                  ,0x93,"int Abc_NtkGetCubePairNum(Abc_Ntk_t *)");
  }
  i = 0;
  uVar4 = 0;
  do {
    if (pNtk->vObjs->nSize <= i) {
      uVar3 = 0x40000000;
      if (uVar4 < 0x40000000) {
        uVar3 = uVar4;
      }
      return (int)uVar3;
    }
    pNode = Abc_NtkObj(pNtk,i);
    if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
      iVar1 = Abc_NodeIsConst(pNode);
      if (iVar1 == 0) {
        if ((char *)(pNode->field_5).pData == (char *)0x0) {
          __assert_fail("pNode->pData",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                        ,0x98,"int Abc_NtkGetCubePairNum(Abc_Ntk_t *)");
        }
        uVar2 = Abc_SopGetCubeNum((char *)(pNode->field_5).pData);
        if (1 < uVar2) {
          uVar4 = uVar4 + ((ulong)(((long)(int)uVar2 + -1) * (long)(int)uVar2) >> 1);
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

int Abc_NtkGetCubePairNum( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i;
    word nCubes, nCubePairs = 0;
    assert( Abc_NtkHasSop(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_NodeIsConst(pNode) )
            continue;
        assert( pNode->pData );
        nCubes = (word)Abc_SopGetCubeNum( (char *)pNode->pData );
        if ( nCubes > 1 )
            nCubePairs += nCubes * (nCubes - 1) / 2;
    }
    return (int)(nCubePairs > (1<<30) ? (1<<30) : nCubePairs);
}